

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O3

void __thiscall
EnrichableAnalyzerSubprocess::Marker::Marker
          (Marker *this,U8 _sampleNumber,string *_channelName,MarkerType _markerType)

{
  (this->channelName)._M_dataplus._M_p = (pointer)&(this->channelName).field_2;
  (this->channelName)._M_string_length = 0;
  (this->channelName).field_2._M_local_buf[0] = '\0';
  this->sampleNumber = _sampleNumber;
  std::__cxx11::string::_M_assign((string *)&this->channelName);
  this->markerType = _markerType;
  return;
}

Assistant:

EnrichableAnalyzerSubprocess::Marker::Marker(
	U8 _sampleNumber, std::string _channelName, AnalyzerResults::MarkerType _markerType
) {
	sampleNumber = _sampleNumber;
	channelName = _channelName;
	markerType = _markerType;
}